

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

double __thiscall smf::MidiFile::getAbsoluteTickTime(MidiFile *this,double starttime)

{
  pointer __base;
  int *piVar1;
  double dVar2;
  _TickTime key;
  undefined4 local_18 [2];
  double local_10;
  
  if ((this->m_timemapvalid == false) && (buildTimeMap(this), this->m_timemapvalid == false)) {
    return -1.0;
  }
  local_18[0] = 0xffffffff;
  __base = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_10 = starttime;
  piVar1 = (int *)bsearch(local_18,__base,
                          (long)(this->m_timemap).
                                super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)__base >> 4,0x10,
                          secondsearch);
  if (piVar1 == (int *)0x0) {
    dVar2 = linearTickInterpolationAtSecond(this,starttime);
  }
  else {
    dVar2 = (double)*piVar1;
  }
  return dVar2;
}

Assistant:

double MidiFile::getAbsoluteTickTime(double starttime) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			if (m_timemapvalid == 0) {
				return -1.0;    // something went wrong
			}
		}
	}

	_TickTime key;
	key.tick    = -1;
	key.seconds = starttime;

	void* ptr = bsearch(&key, m_timemap.data(), m_timemap.size(),
			sizeof(_TickTime), secondsearch);

	if (ptr == NULL) {
		// The specific seconds value was not found, so do a linear
		// search for the two time values which occur before and
		// after the given time value, and do a linear interpolation of
		// the time in tick values to figure out the final time in ticks.
		return linearTickInterpolationAtSecond(starttime);
	} else {
		return ((_TickTime*)ptr)->tick;
	}

}